

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O3

bool Fossilize::merge_concurrent_databases
               (char *append_archive,char **source_paths,size_t num_source_paths,
               bool skip_missing_inputs)

{
  char *path;
  pointer puVar1;
  pointer puVar2;
  int iVar3;
  DatabaseInterface *pDVar4;
  DatabaseInterface *pDVar5;
  size_t sVar6;
  undefined7 in_register_00000009;
  bool bVar7;
  byte bVar8;
  ResourceTag tag;
  uint uVar9;
  ulong uVar10;
  pointer puVar11;
  size_t hash_count;
  vector<unsigned_char,_std::allocator<unsigned_char>_> blob;
  size_t blob_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  allocator_type local_91;
  size_type local_90;
  uint local_84;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  size_type local_68;
  char **local_60;
  size_t local_58;
  size_t local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  uVar10 = CONCAT71(in_register_00000009,skip_missing_inputs) & 0xffffffff;
  bVar7 = false;
  pDVar4 = create_stream_archive_database(append_archive,Append);
  iVar3 = (*pDVar4->_vptr_DatabaseInterface[2])(pDVar4);
  if (((char)iVar3 != '\0') && (bVar7 = true, num_source_paths != 0)) {
    sVar6 = 0;
    local_84 = (uint)CONCAT71(in_register_00000009,skip_missing_inputs);
    local_60 = source_paths;
    local_58 = num_source_paths;
    do {
      path = local_60[sVar6];
      local_50 = sVar6;
      pDVar5 = create_stream_archive_database(path,ReadOnly);
      iVar3 = (*pDVar5->_vptr_DatabaseInterface[2])(pDVar5);
      if ((char)iVar3 == '\0') {
        if ((char)uVar10 == '\0') {
LAB_0014f98f:
          (*pDVar5->_vptr_DatabaseInterface[1])(pDVar5);
          bVar7 = false;
          goto LAB_0014f99b;
        }
        fprintf(_stderr,"Fossilize WARN: Archive %s could not be prepared, skipping.\n",path);
      }
      else {
        uVar10 = 0;
        do {
          local_90 = 0;
          iVar3 = (*pDVar5->_vptr_DatabaseInterface[6])(pDVar5,uVar10,&local_90,0);
          if ((char)iVar3 == '\0') goto LAB_0014f98f;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_48,local_90,(allocator_type *)&local_80);
          iVar3 = (*pDVar5->_vptr_DatabaseInterface[6])(pDVar5,uVar10,&local_90);
          puVar2 = local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          if ((char)iVar3 == '\0') {
LAB_0014f90f:
            bVar8 = 0;
          }
          else {
            puVar1 = local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start ==
                local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              bVar8 = 1;
            }
            else {
              do {
                puVar11 = puVar1 + 1;
                local_68 = 0;
                iVar3 = (*pDVar5->_vptr_DatabaseInterface[3])(pDVar5,uVar10,*puVar1,&local_68,0,1);
                if ((char)iVar3 == '\0') {
                  bVar8 = 0;
                  break;
                }
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                          (&local_80,local_68,&local_91);
                iVar3 = (*pDVar5->_vptr_DatabaseInterface[3])
                                  (pDVar5,uVar10,*puVar1,&local_68,
                                   local_80.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start,1);
                if ((char)iVar3 == '\0') {
                  if (local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_80.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_80.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_80.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  goto LAB_0014f90f;
                }
                iVar3 = (*pDVar4->_vptr_DatabaseInterface[4])
                                  (pDVar4,uVar10,*puVar1,
                                   local_80.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                                   (long)local_80.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_80.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start,1);
                bVar8 = (byte)iVar3;
                if (local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_80.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_80.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_80.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                puVar1 = puVar11;
              } while ((bVar8 & puVar11 != puVar2) != 0);
            }
          }
          if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_48.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (bVar8 == 0) goto LAB_0014f98f;
          uVar9 = (int)uVar10 + 1;
          uVar10 = (ulong)uVar9;
        } while (uVar9 != 10);
      }
      (*pDVar5->_vptr_DatabaseInterface[1])(pDVar5);
      sVar6 = local_50 + 1;
      uVar10 = (ulong)local_84;
    } while (sVar6 != local_58);
    bVar7 = true;
  }
LAB_0014f99b:
  (*pDVar4->_vptr_DatabaseInterface[1])(pDVar4);
  return bVar7;
}

Assistant:

bool merge_concurrent_databases(const char *append_archive, const char * const *source_paths, size_t num_source_paths,
                                bool skip_missing_inputs)
{
	auto append_db = std::unique_ptr<DatabaseInterface>(create_stream_archive_database(append_archive, DatabaseMode::Append));
	if (!append_db->prepare())
		return false;

	for (size_t source = 0; source < num_source_paths; source++)
	{
		const char *path = source_paths[source];
		auto source_db = std::unique_ptr<DatabaseInterface>(create_stream_archive_database(path, DatabaseMode::ReadOnly));
		if (!source_db->prepare())
		{
			if (!skip_missing_inputs)
				return false;

			LOGW("Archive %s could not be prepared, skipping.\n", path);
			continue;
		}

		for (unsigned i = 0; i < RESOURCE_COUNT; i++)
		{
			auto tag = static_cast<ResourceTag>(i);

			size_t hash_count = 0;
			if (!source_db->get_hash_list_for_resource_tag(tag, &hash_count, nullptr))
				return false;
			std::vector<Hash> hashes(hash_count);
			if (!source_db->get_hash_list_for_resource_tag(tag, &hash_count, hashes.data()))
				return false;

			for (auto &hash : hashes)
			{
				size_t blob_size = 0;
				if (!source_db->read_entry(tag, hash, &blob_size, nullptr, PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT))
					return false;
				std::vector<uint8_t> blob(blob_size);
				if (!source_db->read_entry(tag, hash, &blob_size, blob.data(), PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT))
					return false;

				if (!append_db->write_entry(tag, hash, blob.data(), blob.size(), PAYLOAD_WRITE_RAW_FOSSILIZE_DB_BIT))
					return false;
			}
		}
	}

	return true;
}